

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

vector<int,_std::allocator<int>_> *
QUtil::parse_numrange(vector<int,_std::allocator<int>_> *__return_storage_ptr__,char *range,int max)

{
  size_type *__position;
  iterator __position_00;
  pointer piVar1;
  vector<int,std::allocator<int>> *this;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *__s1;
  char *__e;
  pointer psVar7;
  runtime_error *prVar8;
  long lVar9;
  long lVar10;
  size_type *psVar11;
  ulong uVar12;
  size_type *psVar13;
  size_type *psVar14;
  char *__s;
  bool bVar15;
  pointer __v;
  int *piVar16;
  byte bVar17;
  ulong uVar18;
  vector<int,_std::allocator<int>_> last_group;
  vector<int,_std::allocator<int>_> result;
  vector<int,_std::allocator<int>_> work;
  set<int,_std::less<int>,_std::allocator<int>_> exclusions;
  cmatch m;
  anon_class_8_1_ba1d60c4 parse_num;
  int n;
  int local_170;
  char local_169;
  vector<int,_std::allocator<int>_> local_168;
  void *local_148;
  long lStack_140;
  long local_138;
  vector<int,_std::allocator<int>_> local_128;
  char *local_108;
  _Alloc_node local_100;
  string local_f8;
  size_type *local_d8;
  undefined8 local_d0;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_c8;
  char *local_a0;
  ulong local_98;
  int local_8c;
  vector<int,std::allocator<int>> *local_88;
  char *local_80;
  anon_class_8_1_ba1d60c4 local_78;
  int local_70 [16];
  
  local_8c = max;
  local_88 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  if ((parse_numrange(char_const*,int)::group_re_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse_numrange(char_const*,int)::group_re_abi_cxx11_), iVar4 != 0
     )) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_numrange(char_const*,int)::group_re_abi_cxx11_,
               "(x)?(z|r?\\d+)(?:-(z|r?\\d+))?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_numrange(char_const*,int)::group_re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_numrange(char_const*,int)::group_re_abi_cxx11_);
  }
  local_78.max = &local_8c;
  sVar6 = strlen(range);
  local_138 = 0;
  local_148 = (void *)0x0;
  lStack_140 = 0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_f8._M_dataplus._M_p._0_1_ = 0x3a;
  local_a0 = range;
  __s1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                   (range,range + sVar6);
  local_169 = *__s1;
  if (local_169 == ':') {
    iVar4 = strcmp(__s1,":odd");
    if (iVar4 == 0) {
      local_98 = 0;
    }
    else {
      iVar4 = strcmp(__s1,":even");
      if (iVar4 != 0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"expected :even or :odd");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_98 = 1;
    }
  }
  else {
    local_98 = 0;
    __s1 = range + sVar6;
  }
  if (__s1 != range) {
    __position = &local_f8._M_string_length;
    bVar15 = false;
    __s = local_a0;
    local_80 = __s1;
    do {
      local_f8._M_dataplus._M_p._0_1_ = 0x2c;
      __e = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (__s,__s1,&local_f8);
      local_c8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8._M_begin = (char *)0x0;
      local_c8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar3 = std::__detail::
              __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (__s,__e,&local_c8,&parse_numrange(char_const*,int)::group_re_abi_cxx11_,0);
      if (!bVar3) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"invalid range syntax");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar9 = (long)local_c8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar9 == 0) ||
         (lVar10 = (lVar9 >> 3) * -0x5555555555555555, 0xfffffffffffffffd < lVar10 - 5U)) {
        bVar17 = *(byte *)((long)local_c8.
                                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x38);
        if (!bVar15 && (~bVar17 & 1) == 0) goto LAB_00242a39;
LAB_0024246f:
        psVar7 = (pointer)((long)local_c8.
                                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x48);
      }
      else {
        bVar17 = local_c8.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].matched;
        if (!bVar15 && (~bVar17 & 1) == 0) {
LAB_00242a39:
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"first range group may not be an exclusion");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (0xfffffffffffffffc < lVar10 - 6U) goto LAB_0024246f;
        psVar7 = local_c8.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
      }
      if (psVar7->matched == true) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                   (psVar7->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_allocated_capacity =
             local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      iVar4 = parse_numrange::anon_class_8_1_ba1d60c4::operator()(&local_78,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      lVar9 = (long)local_c8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_108 = __s;
      if ((lVar9 == 0) ||
         (bVar15 = false, 0xfffffffffffffffb < (lVar9 >> 3) * -0x5555555555555555 - 7U)) {
        bVar15 = false;
        iVar5 = 0;
        if (*(char *)((long)local_c8.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x38) != '\0') {
          psVar7 = (pointer)((long)local_c8.
                                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x48);
          goto LAB_00242564;
        }
      }
      else {
        iVar5 = 0;
        if (local_c8.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start[3].matched != false) {
          psVar7 = local_c8.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 3;
LAB_00242564:
          if (psVar7->matched == true) {
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f8,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                       (psVar7->super_pair<const_char_*,_const_char_*>).second);
          }
          else {
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            local_f8._M_string_length = 0;
            local_f8.field_2._M_allocated_capacity =
                 local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          iVar5 = parse_numrange::anon_class_8_1_ba1d60c4::operator()(&local_78,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            (ulong)(local_f8.field_2._M_allocated_capacity + 1));
          }
          bVar15 = true;
        }
      }
      if ((bVar17 & 1) == 0) {
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_148,lStack_140,
                   local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        __s1 = local_80;
        local_100._M_t._0_4_ = iVar4;
        if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    ((vector<int,std::allocator<int>> *)&local_168,
                     (iterator)
                     local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_100);
        }
        else {
          *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar4;
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        if (bVar15) {
          iVar4 = (int)local_100._M_t;
          if (iVar5 < (int)local_100._M_t) {
            iVar4 = (int)local_100._M_t + -1;
            do {
              if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_170 = iVar4;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_168,
                           (iterator)
                           local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_170);
              }
              else {
                *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar4;
                local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
                local_170 = iVar4;
              }
              iVar4 = local_170 + -1;
              bVar15 = iVar5 < local_170;
              local_170 = iVar4;
            } while (bVar15);
          }
          else {
            while (local_170 = iVar4 + 1, iVar4 < iVar5) {
              if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_168,
                           (iterator)
                           local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_170);
                iVar4 = local_170;
              }
              else {
                *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_170;
                local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
                iVar4 = local_170;
              }
            }
          }
        }
      }
      else {
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        local_100._M_t._0_4_ = iVar4;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                  ((vector<int,std::allocator<int>> *)&local_128,(iterator)0x0,(int *)&local_100);
        if (bVar15) {
          iVar4 = (int)local_100._M_t;
          if (iVar5 < (int)local_100._M_t) {
            iVar4 = (int)local_100._M_t + -1;
            do {
              if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_170 = iVar4;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_128,
                           (iterator)
                           local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_170);
              }
              else {
                *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar4;
                local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
                local_170 = iVar4;
              }
              iVar4 = local_170 + -1;
              bVar15 = iVar5 < local_170;
              local_170 = iVar4;
            } while (bVar15);
          }
          else {
            while (local_170 = iVar4 + 1, iVar4 < iVar5) {
              if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_128,
                           (iterator)
                           local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_170);
                iVar4 = local_170;
              }
              else {
                *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_170;
                local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
                iVar4 = local_170;
              }
            }
          }
        }
        piVar1 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_f8._M_string_length = local_f8._M_string_length & 0xffffffff00000000;
        local_f8.field_2._M_allocated_capacity = 0;
        local_d0 = 0;
        local_100._M_t =
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_f8;
        local_f8.field_2._8_8_ = __position;
        local_d8 = __position;
        for (__v = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; __v != piVar1; __v = __v + 1) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_f8,(const_iterator)__position,__v,&local_100);
        }
        std::vector<int,_std::allocator<int>_>::operator=(&local_128,&local_168);
        piVar1 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar16 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        for (; piVar16 != piVar1; piVar16 = piVar16 + 1) {
          local_70[0] = *piVar16;
          uVar2 = local_f8.field_2._M_allocated_capacity;
          psVar14 = __position;
          if ((size_type *)local_f8.field_2._M_allocated_capacity == (size_type *)0x0) {
LAB_002427f2:
            if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                        ((vector<int,std::allocator<int>> *)&local_168,
                         (iterator)
                         local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_70);
            }
            else {
              *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_70[0];
              local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            do {
              psVar13 = psVar14;
              psVar11 = (size_type *)uVar2;
              iVar4 = *(int *)(psVar11 + 4);
              psVar14 = psVar11;
              if (iVar4 < local_70[0]) {
                psVar14 = psVar13;
              }
              uVar2 = (size_type *)psVar11[(ulong)(iVar4 < local_70[0]) + 2];
            } while ((size_type *)psVar11[(ulong)(iVar4 < local_70[0]) + 2] != (size_type *)0x0);
            if (psVar14 == __position) goto LAB_002427f2;
            if (iVar4 < local_70[0]) {
              psVar11 = psVar13;
            }
            if (local_70[0] < *(int *)(psVar11 + 4)) goto LAB_002427f2;
          }
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &local_f8);
        __s1 = local_80;
        if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
          __s1 = local_80;
        }
      }
      if ((*__e == ',') && (__e = __e + 1, __e == __s1)) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"trailing comma");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_c8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar15 = true;
      __s = __e;
    } while (__e != __s1);
  }
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)&local_148,lStack_140,
             local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  this = local_88;
  if (local_169 == ':') {
    *(undefined8 *)local_88 = 0;
    *(undefined8 *)(local_88 + 8) = 0;
    *(undefined8 *)(local_88 + 0x10) = 0;
    if (local_98 < (ulong)(lStack_140 - (long)local_148 >> 2)) {
      uVar12 = (ulong)(uint)((int)local_98 * 4);
      uVar18 = local_98;
      do {
        __position_00._M_current = *(int **)(this + 8);
        if (__position_00._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    (this,__position_00,(int *)((long)local_148 + uVar12));
        }
        else {
          *__position_00._M_current = *(int *)((long)local_148 + uVar12);
          *(int **)(this + 8) = __position_00._M_current + 1;
        }
        uVar18 = uVar18 + 2;
        uVar12 = uVar12 + 8;
      } while (uVar18 < (ulong)(lStack_140 - (long)local_148 >> 2));
    }
  }
  else {
    *(void **)local_88 = local_148;
    *(long *)(local_88 + 8) = lStack_140;
    *(long *)(local_88 + 0x10) = local_138;
    local_148 = (void *)0x0;
    lStack_140 = 0;
    local_138 = 0;
  }
  if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148 != (void *)0x0) {
    operator_delete(local_148,local_138 - (long)local_148);
  }
  return (vector<int,_std::allocator<int>_> *)this;
}

Assistant:

std::vector<int>
QUtil::parse_numrange(char const* range, int max)
{
    // Performance note: this implementation aims to be straightforward, not efficient. Numeric
    // range parsing is used only during argument processing. It is not used during processing of
    // PDF files.

    static std::regex group_re(R"((x)?(z|r?\d+)(?:-(z|r?\d+))?)");
    auto parse_num = [&max](std::string const& s) -> int {
        if (s == "z") {
            return max;
        }
        int num;
        if (s.at(0) == 'r') {
            num = max + 1 - string_to_int(s.substr(1).c_str());
        } else {
            num = string_to_int(s.c_str());
        }
        // max == 0 means we don't know the max and are just testing for valid syntax.
        if ((max > 0) && ((num < 1) || (num > max))) {
            throw std::runtime_error("number " + std::to_string(num) + " out of range");
        }
        return num;
    };

    auto populate = [](std::vector<int>& group, int first_num, bool is_span, int last_num) {
        group.clear();
        group.emplace_back(first_num);
        if (is_span) {
            if (first_num > last_num) {
                for (auto i = first_num - 1; i >= last_num; --i) {
                    group.push_back(i);
                }
            } else {
                for (auto i = first_num + 1; i <= last_num; ++i) {
                    group.push_back(i);
                }
            }
        }
    };

    char const* p;
    try {
        char const* range_end = range + strlen(range);
        std::vector<int> result;
        std::vector<int> last_group;
        // See if range ends with :even or :odd.
        size_t start_idx = 0;
        size_t skip = 1;
        p = std::find(range, range_end, ':');
        if (*p == ':') {
            if (strcmp(p, ":odd") == 0) {
                skip = 2;
            } else if (strcmp(p, ":even") == 0) {
                skip = 2;
                start_idx = 1;
            } else {
                throw std::runtime_error("expected :even or :odd");
            }
            range_end = p;
        }

        // Divide the range into groups
        p = range;
        char const* group_end;
        bool first = true;
        while (p != range_end) {
            group_end = std::find(p, range_end, ',');
            std::cmatch m;
            if (!std::regex_match(p, group_end, m, group_re)) {
                throw std::runtime_error("invalid range syntax");
            }
            auto is_exclude = m[1].matched;
            if (first && is_exclude) {
                throw std::runtime_error("first range group may not be an exclusion");
            }
            first = false;
            auto first_num = parse_num(m[2].str());
            auto is_span = m[3].matched;
            int last_num{0};
            if (is_span) {
                last_num = parse_num(m[3].str());
            }
            if (is_exclude) {
                std::vector<int> work;
                populate(work, first_num, is_span, last_num);
                std::set<int> exclusions;
                exclusions.insert(work.begin(), work.end());
                work = last_group;
                last_group.clear();
                for (auto n: work) {
                    if (exclusions.count(n) == 0) {
                        last_group.emplace_back(n);
                    }
                }
            } else {
                result.insert(result.end(), last_group.begin(), last_group.end());
                populate(last_group, first_num, is_span, last_num);
            }
            p = group_end;
            if (*p == ',') {
                ++p;
                if (p == range_end) {
                    throw std::runtime_error("trailing comma");
                }
            }
        }
        result.insert(result.end(), last_group.begin(), last_group.end());
        if (skip == 1) {
            return result;
        }
        std::vector<int> filtered;
        for (auto i = start_idx; i < result.size(); i += skip) {
            filtered.emplace_back(result.at(i));
        }
        return filtered;
    } catch (std::runtime_error const& e) {
        std::string message;
        if (p) {
            message = "error at * in numeric range " +
                std::string(range, QIntC::to_size(p - range)) + "*" + p + ": " + e.what();
        } else {
            message = "error in numeric range " + std::string(range) + ": " + e.what();
        }
        throw std::runtime_error(message);
    }
}